

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::TableauPileWithUncoveredTopTwoCardsTest_tryPullOutZeroCards_Test::TestBody
          (TableauPileWithUncoveredTopTwoCardsTest_tryPullOutZeroCards_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  char *in_R9;
  AssertHelper local_d0;
  Message local_c8;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  local_c0;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  local_a8;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  AssertHelper local_60;
  Message local_58 [3];
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_40;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  TableauPileWithUncoveredTopTwoCardsTest_tryPullOutZeroCards_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  peVar2 = std::
           __shared_ptr_access<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TableauPileWithUncoveredTopTwoCardsTest).
                            super_InitializedTableauPileTest.super_EmptyTableauPileTest.pile);
  (*(peVar2->super_TableauPile).super_Archiver._vptr_Archiver[6])();
  local_21 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                       (&local_40);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~vector(&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_20,
               (AssertionResult *)"pile->tryPullOutCards(0).empty()","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/TableauPileTests.cpp"
               ,0xe0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (&local_c0,
             (testing *)
             &(this->super_TableauPileWithUncoveredTopTwoCardsTest).super_InitializedTableauPileTest
              .pileCards,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            (&local_a8,(internal *)&local_c0,matcher);
  peVar2 = std::
           __shared_ptr_access<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_TableauPileWithUncoveredTopTwoCardsTest).
                            super_InitializedTableauPileTest.super_EmptyTableauPileTest.pile);
  (*(peVar2->super_TableauPile).super_Archiver._vptr_Archiver[7])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_90,(char *)&local_a8,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_a8);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  ::~PolymorphicMatcher(&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/TableauPileTests.cpp"
               ,0xe1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST_F(TableauPileWithUncoveredTopTwoCardsTest, tryPullOutZeroCards) {
    EXPECT_TRUE(pile->tryPullOutCards(0).empty());
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
}